

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_write_attributes_double(void *a,double *attrib,uint32_t nr_of_attribs)

{
  ssize_t sVar1;
  uint8_t *local_40;
  uint8_t *compressed;
  uint32_t nr_of_compressed_bytes;
  uint8_t header;
  trico_archive *arch;
  double *pdStack_20;
  uint32_t nr_of_attribs_local;
  double *attrib_local;
  void *a_local;
  
  compressed._7_1_ = 0x10;
  _nr_of_compressed_bytes = a;
  arch._4_4_ = nr_of_attribs;
  pdStack_20 = attrib;
  attrib_local = (double *)a;
  sVar1 = write((int)&compressed + 7,(void *)0x1,1);
  if ((int)sVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    sVar1 = write((int)&arch + 4,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      trico_compress_double_precision
                ((uint32_t *)&compressed,&local_40,pdStack_20,arch._4_4_,0x14,0x14);
      sVar1 = write((int)&compressed,(void *)0x4,1);
      if ((int)sVar1 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        sVar1 = write((int)local_40,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          trico_free(local_40);
          a_local._4_4_ = 1;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int trico_write_attributes_double(void* a, const double* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_double_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  uint8_t* compressed;
  trico_compress_double_precision(&nr_of_compressed_bytes, &compressed, attrib, nr_of_attribs, 20, 20);

  if (!write(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  trico_free(compressed);

  return 1;
  }